

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O1

int sqlite3BitvecSet(Bitvec *p,u32 i)

{
  anon_union_496_3_7c964c52_for_u *__src;
  u32 uVar1;
  bool bVar2;
  uint uVar3;
  uint *__s;
  void *__dest;
  long lVar4;
  uint uVar5;
  ulong uVar6;
  
  if (p == (Bitvec *)0x0) {
    return 0;
  }
  uVar5 = i - 1;
  while ((0xf80 < p->iSize && (uVar3 = p->iDivisor, uVar3 != 0))) {
    uVar6 = (ulong)uVar5 / (ulong)uVar3;
    uVar5 = uVar5 % uVar3;
    if (*(long *)((long)&p->u + uVar6 * 8) == 0) {
      __s = (uint *)sqlite3Malloc(0x200);
      if (__s != (uint *)0x0) {
        memset(__s,0,0x200);
        *__s = uVar3;
        *(uint **)((long)&p->u + uVar6 * 8) = __s;
        goto LAB_0012da4e;
      }
      *(undefined8 *)((long)&p->u + uVar6 * 8) = 0;
      bVar2 = false;
    }
    else {
LAB_0012da4e:
      p = *(Bitvec **)((long)&p->u + uVar6 * 8);
      bVar2 = true;
    }
    if (!bVar2) {
      return 7;
    }
  }
  __src = &p->u;
  if (p->iSize < 0xf81) {
    __src->aBitmap[uVar5 >> 3] = __src->aBitmap[uVar5 >> 3] | (byte)(1 << ((byte)uVar5 & 7));
    return 0;
  }
  uVar1 = uVar5 + 1;
  uVar6 = (ulong)(uVar5 % 0x7c);
  if (__src->aHash[uVar6] == 0) {
    if (p->nSet < 0x7b) goto LAB_0012db6b;
  }
  else {
    do {
      if (__src->aHash[uVar6] == uVar1) {
        return 0;
      }
      uVar5 = (int)uVar6 + 1;
      uVar6 = (ulong)uVar5;
      if (0x7b < uVar5) {
        uVar6 = 0;
      }
    } while (__src->aHash[uVar6] != 0);
  }
  if (0x3d < p->nSet) {
    __dest = sqlite3Malloc(0x1f0);
    if (__dest == (void *)0x0) {
      return 7;
    }
    memcpy(__dest,__src,0x1f0);
    lVar4 = 0;
    memset(__src,0,0x1f0);
    p->iDivisor = (u32)(((ulong)p->iSize + 0x3d) / 0x3e);
    uVar5 = sqlite3BitvecSet(p,uVar1);
    do {
      uVar1 = *(u32 *)((long)__dest + lVar4 * 4);
      if (uVar1 != 0) {
        uVar3 = sqlite3BitvecSet(p,uVar1);
        uVar5 = uVar5 | uVar3;
      }
      lVar4 = lVar4 + 1;
    } while (lVar4 != 0x7c);
    sqlite3_free(__dest);
    return uVar5;
  }
LAB_0012db6b:
  p->nSet = p->nSet + 1;
  *(u32 *)((long)&p->u + uVar6 * 4) = uVar1;
  return 0;
}

Assistant:

SQLITE_PRIVATE int sqlite3BitvecSet(Bitvec *p, u32 i){
  u32 h;
  if( p==0 ) return SQLITE_OK;
  assert( i>0 );
  assert( i<=p->iSize );
  i--;
  while((p->iSize > BITVEC_NBIT) && p->iDivisor) {
    u32 bin = i/p->iDivisor;
    i = i%p->iDivisor;
    if( p->u.apSub[bin]==0 ){
      p->u.apSub[bin] = sqlite3BitvecCreate( p->iDivisor );
      if( p->u.apSub[bin]==0 ) return SQLITE_NOMEM;
    }
    p = p->u.apSub[bin];
  }
  if( p->iSize<=BITVEC_NBIT ){
    p->u.aBitmap[i/BITVEC_SZELEM] |= 1 << (i&(BITVEC_SZELEM-1));
    return SQLITE_OK;
  }
  h = BITVEC_HASH(i++);
  /* if there wasn't a hash collision, and this doesn't */
  /* completely fill the hash, then just add it without */
  /* worring about sub-dividing and re-hashing. */
  if( !p->u.aHash[h] ){
    if (p->nSet<(BITVEC_NINT-1)) {
      goto bitvec_set_end;
    } else {
      goto bitvec_set_rehash;
    }
  }
  /* there was a collision, check to see if it's already */
  /* in hash, if not, try to find a spot for it */
  do {
    if( p->u.aHash[h]==i ) return SQLITE_OK;
    h++;
    if( h>=BITVEC_NINT ) h = 0;
  } while( p->u.aHash[h] );
  /* we didn't find it in the hash.  h points to the first */
  /* available free spot. check to see if this is going to */
  /* make our hash too "full".  */
bitvec_set_rehash:
  if( p->nSet>=BITVEC_MXHASH ){
    unsigned int j;
    int rc;
    u32 *aiValues = sqlite3StackAllocRaw(0, sizeof(p->u.aHash));
    if( aiValues==0 ){
      return SQLITE_NOMEM;
    }else{
      memcpy(aiValues, p->u.aHash, sizeof(p->u.aHash));
      memset(p->u.apSub, 0, sizeof(p->u.apSub));
      p->iDivisor = (p->iSize + BITVEC_NPTR - 1)/BITVEC_NPTR;
      rc = sqlite3BitvecSet(p, i);
      for(j=0; j<BITVEC_NINT; j++){
        if( aiValues[j] ) rc |= sqlite3BitvecSet(p, aiValues[j]);
      }
      sqlite3StackFree(0, aiValues);
      return rc;
    }
  }
bitvec_set_end:
  p->nSet++;
  p->u.aHash[h] = i;
  return SQLITE_OK;
}